

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::ServiceOptions::InternalSerializeWithCachedSizesToArray
          (ServiceOptions *this,bool deterministic,uint8 *target)

{
  bool value;
  uint uVar1;
  UninterpretedOption *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_48;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  ServiceOptions *this_local;
  
  _i = target;
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    value = deprecated(this);
    _i = internal::WireFormatLite::WriteBoolToArray(0x21,value,target);
  }
  local_48 = 0;
  uVar1 = uninterpreted_option_size(this);
  for (; local_48 < uVar1; local_48 = local_48 + 1) {
    value_00 = uninterpreted_option(this,local_48);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption>
                   (999,value_00,deterministic,_i);
  }
  _i = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                 (&this->_extensions_,1000,0x20000000,deterministic,_i);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ServiceOptions::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* ServiceOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(33, this->deprecated(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceOptions)
  return target;
}